

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

cram_codec *
cram_huffman_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cram_codec *__ptr;
  void *__ptr_00;
  void *pvVar5;
  void *__ptr_01;
  ulong uVar6;
  cram_huffman_code *__base;
  ulong uVar7;
  int iVar8;
  int iVar9;
  kh_m_i2i_t *pkVar10;
  code *pcVar11;
  code *pcVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  byte bVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  
  __ptr = (cram_codec *)malloc(0x240);
  uVar7 = 0;
  if (__ptr != (cram_codec *)0x0) {
    __ptr->codec = E_HUFFMAN;
    lVar20 = 0;
    __ptr_00 = (void *)0x0;
    pvVar5 = (void *)0x0;
    iVar18 = 0;
    do {
      if (st->freqs[lVar20] != 0) {
        iVar8 = (int)uVar7;
        if (iVar18 <= iVar8) {
          bVar21 = iVar18 == 0;
          iVar18 = iVar18 * 2;
          if (bVar21) {
            iVar18 = 0x400;
          }
          __ptr_00 = realloc(__ptr_00,(long)iVar18 << 2);
          pvVar5 = realloc(pvVar5,(long)iVar18 << 2);
          if ((__ptr_00 == (void *)0x0) || (pvVar5 == (void *)0x0)) {
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
            free(__ptr);
            return (cram_codec *)0x0;
          }
        }
        *(int *)((long)__ptr_00 + (long)iVar8 * 4) = (int)lVar20;
        *(int *)((long)pvVar5 + (long)iVar8 * 4) = st->freqs[lVar20];
        if (st->freqs[lVar20] < 1) {
          __assert_fail("st->freqs[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                        ,0x4cb,
                        "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                       );
        }
        uVar7 = (ulong)(iVar8 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x400);
    if (st->h != (kh_m_i2i_t *)0x0) {
      pkVar10 = st->h;
      bVar21 = pkVar10->n_buckets == 0;
      if (!bVar21) {
        bVar19 = 0;
        uVar13 = 0;
        do {
          if ((pkVar10->flags[uVar13 >> 4] >> (bVar19 & 0x1e) & 3) == 0) {
            iVar8 = (int)uVar7;
            if (iVar18 <= iVar8) {
              bVar22 = iVar18 == 0;
              iVar18 = iVar18 * 2;
              if (bVar22) {
                iVar18 = 0x400;
              }
              __ptr_00 = realloc(__ptr_00,(long)iVar18 << 2);
              pvVar5 = realloc(pvVar5,(long)iVar18 << 2);
              if ((__ptr_00 == (void *)0x0) || (pvVar5 == (void *)0x0)) break;
            }
            pkVar10 = st->h;
            *(khint32_t *)((long)__ptr_00 + (long)iVar8 * 4) = pkVar10->keys[uVar13];
            iVar9 = pkVar10->vals[uVar13];
            *(int *)((long)pvVar5 + (long)iVar8 * 4) = iVar9;
            if (iVar9 < 1) {
              __assert_fail("freqs[nvals] > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                            ,0x4e0,
                            "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                           );
            }
            uVar7 = (ulong)(iVar8 + 1);
          }
          uVar13 = uVar13 + 1;
          pkVar10 = st->h;
          bVar19 = bVar19 + 2;
          bVar21 = uVar13 == pkVar10->n_buckets;
        } while (!bVar21);
      }
      if (!bVar21) {
        return (cram_codec *)0x0;
      }
    }
    if ((int)uVar7 < 1) {
      __assert_fail("nvals > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x4e8,
                    "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    uVar6 = (ulong)(uint)((int)uVar7 * 2);
    pvVar5 = realloc(pvVar5,uVar6 * 4);
    __ptr_01 = calloc(uVar6,4);
    if (pvVar5 == (void *)0x0) {
      return (cram_codec *)0x0;
    }
    if (__ptr_01 == (void *)0x0) {
      return (cram_codec *)0x0;
    }
    while( true ) {
      iVar18 = (int)uVar7;
      if (iVar18 < 1) {
        iVar9 = 0x7fffffff;
        iVar8 = 0x7fffffff;
        lVar20 = 0;
        lVar16 = 0;
      }
      else {
        uVar15 = 0;
        uVar6 = 0;
        uVar17 = 0;
        iVar9 = 0x7fffffff;
        iVar4 = 0x7fffffff;
        do {
          iVar2 = *(int *)((long)pvVar5 + uVar15 * 4);
          iVar3 = iVar9;
          iVar8 = iVar4;
          if (-1 < iVar2) {
            if (iVar2 < iVar9) {
              uVar6 = uVar17;
              uVar17 = uVar15 & 0xffffffff;
              iVar3 = iVar2;
              iVar8 = iVar9;
            }
            else {
              if (iVar2 <= iVar4) {
                iVar8 = iVar2;
              }
              if (iVar2 < iVar4) {
                uVar6 = uVar15 & 0xffffffff;
              }
            }
          }
          iVar9 = iVar3;
          uVar15 = uVar15 + 1;
          iVar4 = iVar8;
        } while (uVar7 != uVar15);
        lVar20 = (long)(int)uVar17;
        lVar16 = (long)(int)uVar6;
      }
      if (iVar8 == 0x7fffffff) break;
      *(int *)((long)pvVar5 + uVar7 * 4) = iVar9 + iVar8;
      *(int *)((long)__ptr_01 + lVar20 * 4) = iVar18;
      *(int *)((long)__ptr_01 + lVar16 * 4) = iVar18;
      piVar1 = (int *)((long)pvVar5 + lVar20 * 4);
      *piVar1 = -*piVar1;
      piVar1 = (int *)((long)pvVar5 + lVar16 * 4);
      *piVar1 = -*piVar1;
      uVar7 = (ulong)(iVar18 + 1);
    }
    uVar7 = uVar7 >> 1;
    uVar13 = (int)uVar7 + 1;
    uVar6 = 0;
    do {
      iVar18 = *(int *)((long)__ptr_01 + uVar6 * 4);
      iVar8 = 0;
      if (iVar18 != 0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + 1;
          iVar18 = *(int *)((long)__ptr_01 + (long)iVar18 * 4);
        } while (iVar18 != 0);
      }
      piVar1 = (int *)((long)pvVar5 + uVar6 * 4);
      *piVar1 = -*piVar1;
      *(int *)((long)__ptr_01 + uVar6 * 4) = iVar8;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar13);
    __base = (cram_huffman_code *)malloc((uVar7 + 1) * 0x10);
    if (__base != (cram_huffman_code *)0x0) {
      lVar20 = 0;
      do {
        (&__base->symbol)[lVar20] = *(int32_t *)((long)__ptr_00 + lVar20);
        (&__base->len)[lVar20] = *(int32_t *)((long)__ptr_01 + lVar20);
        lVar20 = lVar20 + 4;
      } while (uVar7 * 4 + 4 != lVar20);
      qsort(__base,uVar7 + 1,0x10,code_sort);
      iVar18 = __base->len;
      uVar7 = 0;
      iVar8 = 0;
      do {
        for (iVar9 = iVar18; iVar9 != __base[uVar7].len; iVar9 = iVar9 + 1) {
          iVar8 = iVar8 * 2;
          iVar18 = __base[uVar7].len;
        }
        __base[uVar7].code = iVar8;
        uVar14 = __base[uVar7].symbol + 1;
        if (uVar14 < 0x81) {
          *(int *)((long)&__ptr->field_6 + (ulong)uVar14 * 4 + 0xc) = (int)uVar7;
        }
        iVar8 = iVar8 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar13);
      free(__ptr_01);
      free(__ptr_00);
      free(pvVar5);
      (__ptr->field_6).e_huffman.codes = __base;
      (__ptr->field_6).e_huffman.nvals = uVar13;
      bVar21 = __base->len == 0;
      pcVar11 = cram_huffman_encode_char;
      if (bVar21) {
        pcVar11 = cram_huffman_encode_char0;
      }
      pcVar12 = cram_huffman_encode_int;
      if (bVar21) {
        pcVar12 = cram_huffman_encode_int0;
      }
      __ptr->free = cram_huffman_encode_free;
      if (option - E_BYTE < 2) {
        pcVar12 = pcVar11;
      }
      __ptr->encode = pcVar12;
      __ptr->store = cram_huffman_encode_store;
      return __ptr;
    }
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_huffman_encode_init(cram_stats *st,
				     enum cram_external_type option,
				     void *dat,
				     int version) {
    int *vals = NULL, *freqs = NULL, vals_alloc = 0, *lens, code, len;
    int nvals, i, ntot = 0, max_val = 0, min_val = INT_MAX, k;
    cram_codec *c;
    cram_huffman_code *codes;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_HUFFMAN;

    /* Count number of unique symbols */
    for (nvals = i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	if (nvals >= vals_alloc) {
	    vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
	    vals  = realloc(vals,  vals_alloc * sizeof(int));
	    freqs = realloc(freqs, vals_alloc * sizeof(int));
	    if (!vals || !freqs) {
		if (vals)  free(vals);
		if (freqs) free(freqs);
		free(c);
		return NULL;
	    }
	}
	vals[nvals] = i;
	freqs[nvals] = st->freqs[i];
	assert(st->freqs[i] > 0);
	ntot += freqs[nvals];
	if (max_val < i) max_val = i;
	if (min_val > i) min_val = i;
	nvals++;
    }
    if (st->h) {
	khint_t k;

	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;
	    if (nvals >= vals_alloc) {
		vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
		vals  = realloc(vals,  vals_alloc * sizeof(int));
		freqs = realloc(freqs, vals_alloc * sizeof(int));
		if (!vals || !freqs)
		    return NULL;
	    }
	    vals[nvals]= kh_key(st->h, k);
	    freqs[nvals] = kh_val(st->h, k);
	    assert(freqs[nvals] > 0);
	    ntot += freqs[nvals];
	    if (max_val < i) max_val = i;
	    if (min_val > i) min_val = i;
	    nvals++;
	}
    }

    assert(nvals > 0);

    freqs = realloc(freqs, 2*nvals*sizeof(*freqs));
    lens = calloc(2*nvals, sizeof(*lens));
    if (!lens || !freqs)
	return NULL;

    /* Inefficient, use pointers to form chain so we can insert and maintain
     * a sorted list? This is currently O(nvals^2) complexity.
     */
    for (;;) {
	int low1 = INT_MAX, low2 = INT_MAX;
	int ind1 = 0, ind2 = 0;
	for (i = 0; i < nvals; i++) {
	    if (freqs[i] < 0)
		continue;
	    if (low1 > freqs[i]) 
		low2 = low1, ind2 = ind1, low1 = freqs[i], ind1 = i;
	    else if (low2 > freqs[i])
		low2 = freqs[i], ind2 = i;
	}
	if (low2 == INT_MAX)
	    break;

	freqs[nvals] = low1 + low2;
	lens[ind1] = nvals;
	lens[ind2] = nvals;
	freqs[ind1] *= -1;
	freqs[ind2] *= -1;
	nvals++;
    }
    nvals = nvals/2+1;

    /* Assign lengths */
    for (i = 0; i < nvals; i++) {
	int code_len = 0;
	for (k = lens[i]; k; k = lens[k])
	    code_len++;
	lens[i] = code_len;
	freqs[i] *= -1;
	//fprintf(stderr, "%d / %d => %d\n", vals[i], freqs[i], lens[i]);
    }


    /* Sort, need in a struct */
    if (!(codes = malloc(nvals * sizeof(*codes))))
	return NULL;
    for (i = 0; i < nvals; i++) {
	codes[i].symbol = vals[i];
	codes[i].len = lens[i];
    }
    qsort(codes, nvals, sizeof(*codes), code_sort);

    /*
     * Generate canonical codes from lengths.
     * Sort by length.
     * Start with 0.
     * Every new code of same length is +1.
     * Every new code of new length is +1 then <<1 per extra length.
     *
     * /\
     * a/\
     * /\/\
     * bcd/\
     *    ef
     * 
     * a 1  0
     * b 3  4 (0+1)<<2
     * c 3  5
     * d 3  6
     * e 4  14  (6+1)<<1
     * f 5  15     
     */
    code = 0; len = codes[0].len;
    for (i = 0; i < nvals; i++) {
	while (len != codes[i].len) {
	    code<<=1;
	    len++;
	}
	codes[i].code = code++;

	if (codes[i].symbol >= -1 && codes[i].symbol < MAX_HUFF)
	    c->e_huffman.val2code[codes[i].symbol+1] = i;

	//fprintf(stderr, "sym %d, code %d, len %d\n",
	//	codes[i].symbol, codes[i].code, codes[i].len);
    }

    free(lens);
    free(vals);
    free(freqs);

    c->e_huffman.codes = codes;
    c->e_huffman.nvals = nvals;

    c->free = cram_huffman_encode_free;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_char0;
	else
	    c->encode = cram_huffman_encode_char;
    } else {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_int0;
	else
	    c->encode = cram_huffman_encode_int;
    }
    c->store = cram_huffman_encode_store;

    return c;
}